

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

LanguageBreakEngine * __thiscall
icu_63::RuleBasedBreakIterator::getLanguageBreakEngine(RuleBasedBreakIterator *this,UChar32 c)

{
  code *pcVar1;
  UBool UVar2;
  int iVar3;
  LanguageBreakEngine *pLVar4;
  UStack *pUVar5;
  ICULanguageBreakFactory *this_00;
  long *plVar6;
  UnhandledEngine *this_01;
  undefined4 in_register_00000034;
  code *status_00;
  int32_t index;
  UErrorCode status;
  UErrorCode local_30;
  UErrorCode local_2c;
  
  status_00 = (code *)CONCAT44(in_register_00000034,c);
  pcVar1 = (code *)(ulong)(uint)c;
  local_30 = U_ZERO_ERROR;
  if (this->fLanguageBreakEngines == (UStack *)0x0) {
    pUVar5 = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
    if (pUVar5 == (UStack *)0x0) {
      pUVar5 = (UStack *)0x0;
    }
    else {
      status_00 = (code *)&local_30;
      UStack::UStack(pUVar5,(UErrorCode *)status_00);
    }
    this->fLanguageBreakEngines = pUVar5;
    if (pUVar5 != (UStack *)0x0) {
      if (local_30 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002a953b;
      if (pUVar5 != (UStack *)0x0) {
        (*(pUVar5->super_UVector).super_UObject._vptr_UObject[1])(pUVar5);
      }
    }
    this->fLanguageBreakEngines = (UStack *)0x0;
  }
  else {
LAB_002a953b:
    index = (this->fLanguageBreakEngines->super_UVector).count;
    while (0 < index) {
      index = index + -1;
      pLVar4 = (LanguageBreakEngine *)
               UVector::elementAt(&this->fLanguageBreakEngines->super_UVector,index);
      status_00 = pcVar1;
      iVar3 = (*pLVar4->_vptr_LanguageBreakEngine[2])(pLVar4);
      if ((char)iVar3 != '\0') {
        return pLVar4;
      }
    }
    if ((gLanguageBreakFactoriesInitOnce.fState.super___atomic_base<int>._M_i != 2) &&
       (UVar2 = umtx_initImplPreInit(&gLanguageBreakFactoriesInitOnce), UVar2 != '\0')) {
      local_2c = U_ZERO_ERROR;
      pUVar5 = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
      if (pUVar5 == (UStack *)0x0) {
        pUVar5 = (UStack *)0x0;
      }
      else {
        status_00 = _deleteFactory;
        UStack::UStack(pUVar5,_deleteFactory,(UElementsAreEqual *)0x0,&local_2c);
      }
      gLanguageBreakFactories = pUVar5;
      if ((pUVar5 != (UStack *)0x0) && (local_2c < U_ILLEGAL_ARGUMENT_ERROR)) {
        this_00 = (ICULanguageBreakFactory *)
                  UMemory::operator_new((UMemory *)0x10,(size_t)status_00);
        if (this_00 == (ICULanguageBreakFactory *)0x0) {
          this_00 = (ICULanguageBreakFactory *)0x0;
        }
        else {
          ICULanguageBreakFactory::ICULanguageBreakFactory(this_00,&local_2c);
        }
        UVector::addElement(&gLanguageBreakFactories->super_UVector,this_00,&local_2c);
      }
      status_00 = rbbi_cleanup;
      ucln_common_registerCleanup_63(UCLN_COMMON_RBBI,rbbi_cleanup);
      umtx_initImplPostInit(&gLanguageBreakFactoriesInitOnce);
    }
    if ((gLanguageBreakFactories == (UStack *)0x0) ||
       (iVar3 = (gLanguageBreakFactories->super_UVector).count, iVar3 < 1)) {
      pLVar4 = (LanguageBreakEngine *)0x0;
    }
    else {
      do {
        plVar6 = (long *)UVector::elementAt(&gLanguageBreakFactories->super_UVector,iVar3 + -1);
        status_00 = pcVar1;
        pLVar4 = (LanguageBreakEngine *)(**(code **)(*plVar6 + 0x10))(plVar6);
        if (iVar3 < 2) break;
        iVar3 = iVar3 + -1;
      } while (pLVar4 == (LanguageBreakEngine *)0x0);
    }
    if (pLVar4 != (LanguageBreakEngine *)0x0) {
      UVector::addElement(&this->fLanguageBreakEngines->super_UVector,pLVar4,&local_30);
      return pLVar4;
    }
    if (this->fUnhandledBreakEngine != (UnhandledEngine *)0x0) {
LAB_002a96ff:
      (*(this->fUnhandledBreakEngine->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[4])
                (this->fUnhandledBreakEngine,pcVar1);
      return &this->fUnhandledBreakEngine->super_LanguageBreakEngine;
    }
    this_01 = (UnhandledEngine *)UMemory::operator_new((UMemory *)0x10,(size_t)status_00);
    if (this_01 == (UnhandledEngine *)0x0) {
      this_01 = (UnhandledEngine *)0x0;
    }
    else {
      UnhandledEngine::UnhandledEngine(this_01,&local_30);
    }
    this->fUnhandledBreakEngine = this_01;
    if ((this_01 != (UnhandledEngine *)0x0) || (U_ZERO_ERROR < local_30)) {
      UVector::insertElementAt(&this->fLanguageBreakEngines->super_UVector,this_01,0,&local_30);
      if (local_30 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002a96ff;
      if (this->fUnhandledBreakEngine != (UnhandledEngine *)0x0) {
        (*(this->fUnhandledBreakEngine->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[1])();
      }
      this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
    }
  }
  return (LanguageBreakEngine *)0x0;
}

Assistant:

const LanguageBreakEngine *
RuleBasedBreakIterator::getLanguageBreakEngine(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode status = U_ZERO_ERROR;

    if (fLanguageBreakEngines == NULL) {
        fLanguageBreakEngines = new UStack(status);
        if (fLanguageBreakEngines == NULL || U_FAILURE(status)) {
            delete fLanguageBreakEngines;
            fLanguageBreakEngines = 0;
            return NULL;
        }
    }

    int32_t i = fLanguageBreakEngines->size();
    while (--i >= 0) {
        lbe = (const LanguageBreakEngine *)(fLanguageBreakEngines->elementAt(i));
        if (lbe->handles(c)) {
            return lbe;
        }
    }

    // No existing dictionary took the character. See if a factory wants to
    // give us a new LanguageBreakEngine for this character.
    lbe = getLanguageBreakEngineFromFactory(c);

    // If we got one, use it and push it on our stack.
    if (lbe != NULL) {
        fLanguageBreakEngines->push((void *)lbe, status);
        // Even if we can't remember it, we can keep looking it up, so
        // return it even if the push fails.
        return lbe;
    }

    // No engine is forthcoming for this character. Add it to the
    // reject set. Create the reject break engine if needed.
    if (fUnhandledBreakEngine == NULL) {
        fUnhandledBreakEngine = new UnhandledEngine(status);
        if (U_SUCCESS(status) && fUnhandledBreakEngine == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return nullptr;
        }
        // Put it last so that scripts for which we have an engine get tried
        // first.
        fLanguageBreakEngines->insertElementAt(fUnhandledBreakEngine, 0, status);
        // If we can't insert it, or creation failed, get rid of it
        if (U_FAILURE(status)) {
            delete fUnhandledBreakEngine;
            fUnhandledBreakEngine = 0;
            return NULL;
        }
    }

    // Tell the reject engine about the character; at its discretion, it may
    // add more than just the one character.
    fUnhandledBreakEngine->handleCharacter(c);

    return fUnhandledBreakEngine;
}